

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md32_common.h
# Opt level: O2

void crypto_md32_update(crypto_md32_block_func block_func,uint32_t *h,uint8_t *data,
                       size_t block_size,uint *num,uint32_t *Nh,uint32_t *Nl,uint8_t *in,size_t len)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  size_t __n;
  
  if (in != (uint8_t *)0x0) {
    uVar2 = (int)in * 8;
    uVar1 = *Nh;
    *num = *num + (int)((ulong)in >> 0x1d) + (uint)CARRY4(uVar2,*Nh);
    *Nh = uVar2 + uVar1;
    uVar3 = (ulong)*(uint *)block_size;
    if (uVar3 != 0) {
      if (in + uVar3 < (uint8_t *)0x40 && in < (uint8_t *)0x40) {
        memcpy(data + uVar3,Nl,(size_t)in);
        *(int *)block_size = *(int *)block_size + (int)in;
        return;
      }
      __n = -(uVar3 - 0x40);
      if (uVar3 != 0x40) {
        memcpy(data + uVar3,Nl,__n);
      }
      (*block_func)(h,data,1);
      Nl = (uint32_t *)((long)Nl + __n);
      in = in + (uVar3 - 0x40);
      *(undefined4 *)block_size = 0;
      data[0x30] = '\0';
      data[0x31] = '\0';
      data[0x32] = '\0';
      data[0x33] = '\0';
      data[0x34] = '\0';
      data[0x35] = '\0';
      data[0x36] = '\0';
      data[0x37] = '\0';
      data[0x38] = '\0';
      data[0x39] = '\0';
      data[0x3a] = '\0';
      data[0x3b] = '\0';
      data[0x3c] = '\0';
      data[0x3d] = '\0';
      data[0x3e] = '\0';
      data[0x3f] = '\0';
      data[0x20] = '\0';
      data[0x21] = '\0';
      data[0x22] = '\0';
      data[0x23] = '\0';
      data[0x24] = '\0';
      data[0x25] = '\0';
      data[0x26] = '\0';
      data[0x27] = '\0';
      data[0x28] = '\0';
      data[0x29] = '\0';
      data[0x2a] = '\0';
      data[0x2b] = '\0';
      data[0x2c] = '\0';
      data[0x2d] = '\0';
      data[0x2e] = '\0';
      data[0x2f] = '\0';
      data[0x10] = '\0';
      data[0x11] = '\0';
      data[0x12] = '\0';
      data[0x13] = '\0';
      data[0x14] = '\0';
      data[0x15] = '\0';
      data[0x16] = '\0';
      data[0x17] = '\0';
      data[0x18] = '\0';
      data[0x19] = '\0';
      data[0x1a] = '\0';
      data[0x1b] = '\0';
      data[0x1c] = '\0';
      data[0x1d] = '\0';
      data[0x1e] = '\0';
      data[0x1f] = '\0';
      data[0] = '\0';
      data[1] = '\0';
      data[2] = '\0';
      data[3] = '\0';
      data[4] = '\0';
      data[5] = '\0';
      data[6] = '\0';
      data[7] = '\0';
      data[8] = '\0';
      data[9] = '\0';
      data[10] = '\0';
      data[0xb] = '\0';
      data[0xc] = '\0';
      data[0xd] = '\0';
      data[0xe] = '\0';
      data[0xf] = '\0';
    }
    if ((uint8_t *)0x3f < in) {
      (*block_func)(h,(uint8_t *)Nl,(ulong)in >> 6);
      Nl = (uint32_t *)((long)Nl + ((ulong)in & 0xffffffffffffffc0));
      in = (uint8_t *)(ulong)((uint)in & 0x3f);
    }
    if (in != (uint8_t *)0x0) {
      *(int *)block_size = (int)in;
      memcpy(data,Nl,(size_t)in);
      return;
    }
  }
  return;
}

Assistant:

static inline void crypto_md32_update(crypto_md32_block_func block_func,
                                      uint32_t *h, uint8_t *data,
                                      size_t block_size, unsigned *num,
                                      uint32_t *Nh, uint32_t *Nl,
                                      const uint8_t *in, size_t len) {
  if (len == 0) {
    return;
  }

  uint32_t l = *Nl + (((uint32_t)len) << 3);
  if (l < *Nl) {
    // Handle carries.
    (*Nh)++;
  }
  *Nh += (uint32_t)(len >> 29);
  *Nl = l;

  size_t n = *num;
  if (n != 0) {
    if (len >= block_size || len + n >= block_size) {
      OPENSSL_memcpy(data + n, in, block_size - n);
      block_func(h, data, 1);
      n = block_size - n;
      in += n;
      len -= n;
      *num = 0;
      // Keep |data| zeroed when unused.
      OPENSSL_memset(data, 0, block_size);
    } else {
      OPENSSL_memcpy(data + n, in, len);
      *num += (unsigned)len;
      return;
    }
  }

  n = len / block_size;
  if (n > 0) {
    block_func(h, in, n);
    n *= block_size;
    in += n;
    len -= n;
  }

  if (len != 0) {
    *num = (unsigned)len;
    OPENSSL_memcpy(data, in, len);
  }
}